

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::OnTable
          (BinaryReaderObjdump *this,Index index,Type elem_type,Limits *elem_limits)

{
  string_view sVar1;
  Type local_48;
  string local_40;
  
  local_48 = elem_type;
  Type::GetName_abi_cxx11_(&local_40,&local_48);
  PrintDetails(this," - table[%u] type=%s initial=%ld",index,local_40._M_dataplus._M_p,
               elem_limits->initial);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (elem_limits->has_max == true) {
    PrintDetails(this," max=%ld",elem_limits->max);
  }
  sVar1 = ObjdumpNames::Get(&((this->super_BinaryReaderObjdumpBase).objdump_state_)->table_names,
                            index);
  if (sVar1._M_len != 0) {
    PrintDetails(this," <%.*s>",(ulong)(uint)sVar1._M_len,sVar1._M_str);
  }
  if (elem_limits->is_64 == true) {
    PrintDetails(this," i64");
  }
  PrintDetails(this,"\n");
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::OnTable(Index index,
                                    Type elem_type,
                                    const Limits* elem_limits) {
  PrintDetails(" - table[%" PRIindex "] type=%s initial=%" PRId64, index,
               elem_type.GetName().c_str(), elem_limits->initial);
  if (elem_limits->has_max) {
    PrintDetails(" max=%" PRId64, elem_limits->max);
  }
  auto name = GetTableName(index);
  if (!name.empty()) {
    PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
  }
  if (elem_limits->is_64) {
    PrintDetails(" i64");
  }
  PrintDetails("\n");
  return Result::Ok;
}